

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall unitOps_power_Test::~unitOps_power_Test(unitOps_power_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, power)
{
    auto m2 = m.pow(2);
    EXPECT_EQ(m * m, m2);
    auto m4 = pow(m, 4);  // use the free function form
    EXPECT_EQ(m * m * m * m, m4);
    auto m4_b = m2.pow(2);
    EXPECT_EQ(m4_b, m * m * m * m);
    EXPECT_EQ(m4_b, m2 * m2);

    EXPECT_EQ(m.inv(), m.pow(-1));
    EXPECT_EQ(m.inv().inv(), m.pow(-1).pow(-1));
}